

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v1.cpp
# Opt level: O0

void __thiscall intel_acbp_v1_t::_read(intel_acbp_v1_t *this)

{
  uint8_t uVar1;
  uint16_t uVar2;
  structure_ids_t sVar3;
  validation_not_equal_error<intel_acbp_v1_t::structure_ids_t> *this_00;
  kstream *pkVar4;
  validation_expr_error<unsigned_char> *this_01;
  vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>
  *this_02;
  acbp_element_t *this_03;
  pointer this_04;
  common_header_t *this_05;
  bool local_109;
  unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>
  local_a0;
  pointer local_98;
  acbp_element_t *__1;
  int i;
  undefined1 local_7a;
  allocator local_79;
  string local_78;
  uint8_t local_54;
  byte local_53;
  undefined1 local_52;
  allocator local_51;
  undefined1 local_50 [5];
  uint8_t _;
  structure_ids_t local_20 [2];
  intel_acbp_v1_t *local_10;
  intel_acbp_v1_t *this_local;
  
  local_10 = this;
  sVar3 = kaitai::kstream::read_u8le((this->super_kstruct).m__io);
  this->m_structure_id = sVar3;
  sVar3 = structure_id(this);
  if (sVar3 != STRUCTURE_IDS_ACBP) {
    local_52 = 1;
    this_00 = (validation_not_equal_error<intel_acbp_v1_t::structure_ids_t> *)
              __cxa_allocate_exception(0x48);
    local_20[1] = 0x5f5f504243415f5f;
    local_20[0] = structure_id(this);
    pkVar4 = kaitai::kstruct::_io(&this->super_kstruct);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_50,"/seq/0",&local_51);
    kaitai::validation_not_equal_error<intel_acbp_v1_t::structure_ids_t>::validation_not_equal_error
              (this_00,local_20 + 1,local_20,pkVar4,(string *)local_50);
    local_52 = 0;
    __cxa_throw(this_00,&kaitai::validation_not_equal_error<intel_acbp_v1_t::structure_ids_t>::
                         typeinfo,
                kaitai::validation_not_equal_error<intel_acbp_v1_t::structure_ids_t>::
                ~validation_not_equal_error);
  }
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_version = uVar1;
  local_53 = version(this);
  if (0x1f < local_53) {
    local_7a = 1;
    this_01 = (validation_expr_error<unsigned_char> *)__cxa_allocate_exception(0x40);
    local_54 = version(this);
    pkVar4 = kaitai::kstruct::_io(&this->super_kstruct);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,"/seq/1",&local_79);
    kaitai::validation_expr_error<unsigned_char>::validation_expr_error
              (this_01,&local_54,pkVar4,&local_78);
    local_7a = 0;
    __cxa_throw(this_01,&kaitai::validation_expr_error<unsigned_char>::typeinfo,
                kaitai::validation_expr_error<unsigned_char>::~validation_expr_error);
  }
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_reserved0 = uVar1;
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_bpm_revision = uVar1;
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_bp_svn = uVar1;
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_acm_svn = uVar1;
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_reserved1 = uVar1;
  uVar2 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_nem_data_size = uVar2;
  this_02 = (vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>
             *)operator_new(0x18);
  memset(this_02,0,0x18);
  std::
  vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>
  ::vector(this_02);
  std::
  unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>>>,std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>>>>>
  ::
  unique_ptr<std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>>>>,void>
            ((unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>>>,std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>>>>>
              *)&stack0xffffffffffffff78,this_02);
  std::
  unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>_>_>
  ::operator=(&this->m_elements,
              (unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>_>_>
               *)&stack0xffffffffffffff78);
  std::
  unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>_>_>
                 *)&stack0xffffffffffffff78);
  __1._4_4_ = 0;
  do {
    this_03 = (acbp_element_t *)operator_new(0x80);
    acbp_element_t::acbp_element_t(this_03,(this->super_kstruct).m__io,this,this->m__root);
    local_98 = this_03;
    this_04 = std::
              unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>_>_>
              ::operator->(&this->m_elements);
    std::
    unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>
    ::unique_ptr<std::default_delete<intel_acbp_v1_t::acbp_element_t>,void>
              ((unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>
                *)&local_a0,local_98);
    std::
    vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>
    ::push_back(this_04,(value_type *)&local_a0);
    std::
    unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>
    ::~unique_ptr(&local_a0);
    __1._4_4_ = __1._4_4_ + 1;
    this_05 = acbp_element_t::header(local_98);
    sVar3 = common_header_t::structure_id(this_05);
    local_109 = true;
    if (sVar3 != STRUCTURE_IDS_PMSG) {
      pkVar4 = kaitai::kstruct::_io(&this->super_kstruct);
      local_109 = kaitai::kstream::is_eof(pkVar4);
    }
  } while (((local_109 ^ 0xffU) & 1) != 0);
  return;
}

Assistant:

void intel_acbp_v1_t::_read() {
    m_structure_id = static_cast<intel_acbp_v1_t::structure_ids_t>(m__io->read_u8le());
    if (!(structure_id() == intel_acbp_v1_t::STRUCTURE_IDS_ACBP)) {
        throw kaitai::validation_not_equal_error<intel_acbp_v1_t::structure_ids_t>(intel_acbp_v1_t::STRUCTURE_IDS_ACBP, structure_id(), _io(), std::string("/seq/0"));
    }
    m_version = m__io->read_u1();
    {
        uint8_t _ = version();
        if (!(_ < 32)) {
            throw kaitai::validation_expr_error<uint8_t>(version(), _io(), std::string("/seq/1"));
        }
    }
    m_reserved0 = m__io->read_u1();
    m_bpm_revision = m__io->read_u1();
    m_bp_svn = m__io->read_u1();
    m_acm_svn = m__io->read_u1();
    m_reserved1 = m__io->read_u1();
    m_nem_data_size = m__io->read_u2le();
    m_elements = std::unique_ptr<std::vector<std::unique_ptr<acbp_element_t>>>(new std::vector<std::unique_ptr<acbp_element_t>>());
    {
        int i = 0;
        acbp_element_t* _;
        do {
            _ = new acbp_element_t(m__io, this, m__root);
            m_elements->push_back(std::move(std::unique_ptr<acbp_element_t>(_)));
            i++;
        } while (!( ((_->header()->structure_id() == intel_acbp_v1_t::STRUCTURE_IDS_PMSG) || (_io()->is_eof())) ));
    }
}